

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zhuffman_decode_slowpath(stbi__zbuf *a,stbi__zhuffman *z)

{
  int iVar1;
  uint local_28;
  int k;
  int s;
  int b;
  stbi__zhuffman *z_local;
  stbi__zbuf *a_local;
  
  iVar1 = stbi__bit_reverse(a->code_buffer,0x10);
  for (local_28 = 10; z->maxcode[(int)local_28] <= iVar1; local_28 = local_28 + 1) {
  }
  if (local_28 == 0x10) {
    a_local._4_4_ = 0xffffffff;
  }
  else {
    iVar1 = ((iVar1 >> (0x10 - (byte)local_28 & 0x1f)) - (uint)z->firstcode[(int)local_28]) +
            (uint)z->firstsymbol[(int)local_28];
    if (z->size[iVar1] != local_28) {
      __assert_fail("z->size[b] == s",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image.h"
                    ,0xf55,"int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
    }
    a->code_buffer = a->code_buffer >> ((byte)local_28 & 0x1f);
    a->num_bits = a->num_bits - local_28;
    a_local._4_4_ = (uint)z->value[iVar1];
  }
  return a_local._4_4_;
}

Assistant:

static int stbi__zhuffman_decode_slowpath(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s,k;
   // not resolved by fast table, so compute it the slow way
   // use jpeg approach, which requires MSbits at top
   k = stbi__bit_reverse(a->code_buffer, 16);
   for (s=STBI__ZFAST_BITS+1; ; ++s)
      if (k < z->maxcode[s])
         break;
   if (s == 16) return -1; // invalid code!
   // code size is s, so:
   b = (k >> (16-s)) - z->firstcode[s] + z->firstsymbol[s];
   STBI_ASSERT(z->size[b] == s);
   a->code_buffer >>= s;
   a->num_bits -= s;
   return z->value[b];
}